

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

char * __thiscall FStringTable::operator[](FStringTable *this,char *name)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  StringEntry *pSVar4;
  
  if (name == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar1 = MakeKey(name);
    pSVar4 = (StringEntry *)(this->Buckets + (uVar1 & 0x7f));
    do {
      pSVar4 = pSVar4->Next;
      if (pSVar4 == (StringEntry *)0x0) {
        return (char *)0x0;
      }
      iVar2 = strcasecmp(pSVar4->Name,name);
      if (iVar2 == 1) {
        return (char *)0x0;
      }
    } while (iVar2 != 0);
    pcVar3 = &pSVar4->field_0x11;
  }
  return pcVar3;
}

Assistant:

const char *FStringTable::operator[] (const char *name) const
{
	if (name == NULL)
	{
		return NULL;
	}
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry *entry = Buckets[bucket];

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			return entry->String;
		}
		if (cmpval == 1)
		{
			return NULL;
		}
		entry = entry->Next;
	}
	return NULL;
}